

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void glcts::prepareTextureCoordinatesForGatherForFace
               (GLfloat *data,GLuint width,GLuint height,GLfloat layer,GLuint face)

{
  float fVar1;
  GLfloat GVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  GLfloat GVar9;
  float fVar10;
  GLfloat GVar11;
  GLfloat GVar12;
  GLfloat GVar13;
  GLfloat GVar14;
  float fVar15;
  
  if (5 < face) goto LAB_00d415e1;
  fVar8 = 2.0 / (float)width;
  fVar4 = 2.0 / (float)height;
  GVar11 = -1.0;
  fVar1 = 1.0;
  fVar7 = fVar8 * 0.5 + -1.0 + fVar8;
  GVar2 = (1.0 - fVar8 * 0.5) - fVar8;
  GVar9 = (1.0 - fVar4 * 0.5) - fVar4;
  fVar4 = fVar4 * 0.5 + -1.0 + fVar4;
  GVar12 = 0.0;
  GVar13 = GVar2;
  switch(face) {
  case 0:
    uVar5 = 0x3f800000;
    goto LAB_00d414d0;
  case 1:
    uVar5 = 0xbf800000;
    fVar1 = -1.0;
LAB_00d414d0:
    uVar6 = (ulong)uVar5;
    fVar8 = 0.0;
    fVar3 = GVar2;
    fVar10 = 0.0;
    GVar13 = fVar1;
    GVar14 = fVar7;
    GVar11 = fVar4;
    fVar4 = fVar7;
    fVar15 = GVar2;
    break;
  case 2:
    uVar6 = 0x3f80000000000000;
    fVar8 = 1.0;
    fVar1 = fVar7;
    fVar3 = fVar8;
    fVar7 = fVar8;
    fVar10 = fVar8;
    GVar14 = fVar8;
    GVar11 = fVar4;
    GVar2 = fVar8;
    fVar4 = fVar8;
    fVar15 = fVar8;
    break;
  case 3:
    uVar6 = 0xbf80000000000000;
    fVar8 = -1.0;
    fVar1 = fVar7;
    fVar3 = fVar8;
    fVar7 = fVar8;
    fVar10 = fVar8;
    GVar14 = fVar8;
    GVar11 = fVar4;
    GVar2 = fVar8;
    fVar4 = fVar8;
    fVar15 = fVar8;
    break;
  case 4:
    GVar11 = 1.0;
    goto LAB_00d414fa;
  case 5:
LAB_00d414fa:
    uVar6 = 0;
    fVar8 = fVar4;
    fVar1 = fVar7;
    fVar3 = GVar9;
    fVar7 = GVar9;
    fVar10 = GVar9;
    GVar9 = GVar11;
    GVar12 = GVar11;
    GVar14 = 0.0;
    GVar2 = 0.0;
    fVar15 = fVar4;
  }
  *data = fVar1;
  data[1] = fVar7;
  data[2] = GVar9;
  data[3] = layer;
  data[4] = (GLfloat)uVar6;
  data[5] = fVar10;
  data[6] = GVar9;
  data[7] = layer;
  data[8] = GVar13;
  data[9] = fVar3;
  data[10] = GVar9;
  data[0xb] = layer;
  data[0xc] = fVar1;
  data[0xd] = GVar14;
  data[0xe] = GVar12;
  data[0xf] = layer;
  *(ulong *)(data + 0x10) = uVar6;
  data[0x12] = GVar12;
  data[0x13] = layer;
  data[0x14] = GVar13;
  data[0x15] = GVar2;
  data[0x16] = GVar12;
  data[0x17] = layer;
  data[0x18] = fVar1;
  data[0x19] = fVar4;
  data[0x1a] = GVar11;
  data[0x1b] = layer;
  data[0x1c] = (GLfloat)uVar6;
  data[0x1d] = fVar8;
  data[0x1e] = GVar11;
  data[0x1f] = layer;
  data[0x20] = GVar13;
  data[0x21] = fVar15;
  data[0x22] = GVar11;
  data[0x23] = layer;
LAB_00d415e1:
  vectorNormalize<3u,4u>(data,0);
  vectorNormalize<3u,4u>(data,1);
  vectorNormalize<3u,4u>(data,2);
  vectorNormalize<3u,4u>(data,3);
  vectorNormalize<3u,4u>(data,4);
  vectorNormalize<3u,4u>(data,5);
  vectorNormalize<3u,4u>(data,6);
  vectorNormalize<3u,4u>(data,7);
  vectorNormalize<3u,4u>(data,8);
  return;
}

Assistant:

void prepareTextureCoordinatesForGatherForFace(glw::GLfloat* data, glw::GLuint width, glw::GLuint height,
											   glw::GLfloat layer, glw::GLuint face)
{
	const glw::GLfloat x_range = (glw::GLfloat)width;
	const glw::GLfloat y_range = (glw::GLfloat)height;

	const glw::GLfloat x_step = 2.0f / x_range;
	const glw::GLfloat y_step = 2.0f / y_range;

	const glw::GLfloat x_mid_step = x_step / 2.0f;
	const glw::GLfloat y_mid_step = y_step / 2.0f;

	const glw::GLfloat left		= -1.0f + x_mid_step + x_step;
	const glw::GLfloat right	= 1.0f - x_mid_step - x_step;
	const glw::GLfloat top		= 1.0f - y_mid_step - y_step;
	const glw::GLfloat bottom   = -1.0f + y_mid_step + y_step;
	const glw::GLfloat middle   = 0.0f;
	const glw::GLfloat negative = -1.0f;
	const glw::GLfloat positive = 1.0f;

	switch (face)
	{
	case 0:
		vectorSet4(data, 0, positive, left, top, layer);
		vectorSet4(data, 1, positive, middle, top, layer);
		vectorSet4(data, 2, positive, right, top, layer);
		vectorSet4(data, 3, positive, left, middle, layer);
		vectorSet4(data, 4, positive, middle, middle, layer);
		vectorSet4(data, 5, positive, right, middle, layer);
		vectorSet4(data, 6, positive, left, bottom, layer);
		vectorSet4(data, 7, positive, middle, bottom, layer);
		vectorSet4(data, 8, positive, right, bottom, layer);
		break;
	case 1:
		vectorSet4(data, 0, negative, left, top, layer);
		vectorSet4(data, 1, negative, middle, top, layer);
		vectorSet4(data, 2, negative, right, top, layer);
		vectorSet4(data, 3, negative, left, middle, layer);
		vectorSet4(data, 4, negative, middle, middle, layer);
		vectorSet4(data, 5, negative, right, middle, layer);
		vectorSet4(data, 6, negative, left, bottom, layer);
		vectorSet4(data, 7, negative, middle, bottom, layer);
		vectorSet4(data, 8, negative, right, bottom, layer);
		break;
	case 2:
		vectorSet4(data, 0, left, positive, top, layer);
		vectorSet4(data, 1, middle, positive, top, layer);
		vectorSet4(data, 2, right, positive, top, layer);
		vectorSet4(data, 3, left, positive, middle, layer);
		vectorSet4(data, 4, middle, positive, middle, layer);
		vectorSet4(data, 5, right, positive, middle, layer);
		vectorSet4(data, 6, left, positive, bottom, layer);
		vectorSet4(data, 7, middle, positive, bottom, layer);
		vectorSet4(data, 8, right, positive, bottom, layer);
		break;
	case 3:
		vectorSet4(data, 0, left, negative, top, layer);
		vectorSet4(data, 1, middle, negative, top, layer);
		vectorSet4(data, 2, right, negative, top, layer);
		vectorSet4(data, 3, left, negative, middle, layer);
		vectorSet4(data, 4, middle, negative, middle, layer);
		vectorSet4(data, 5, right, negative, middle, layer);
		vectorSet4(data, 6, left, negative, bottom, layer);
		vectorSet4(data, 7, middle, negative, bottom, layer);
		vectorSet4(data, 8, right, negative, bottom, layer);
		break;
	case 4:
		vectorSet4(data, 0, left, top, positive, layer);
		vectorSet4(data, 1, middle, top, positive, layer);
		vectorSet4(data, 2, right, top, positive, layer);
		vectorSet4(data, 3, left, middle, positive, layer);
		vectorSet4(data, 4, middle, middle, positive, layer);
		vectorSet4(data, 5, right, middle, positive, layer);
		vectorSet4(data, 6, left, bottom, positive, layer);
		vectorSet4(data, 7, middle, bottom, positive, layer);
		vectorSet4(data, 8, right, bottom, positive, layer);
		break;
	case 5:
		vectorSet4(data, 0, left, top, negative, layer);
		vectorSet4(data, 1, middle, top, negative, layer);
		vectorSet4(data, 2, right, top, negative, layer);
		vectorSet4(data, 3, left, middle, negative, layer);
		vectorSet4(data, 4, middle, middle, negative, layer);
		vectorSet4(data, 5, right, middle, negative, layer);
		vectorSet4(data, 6, left, bottom, negative, layer);
		vectorSet4(data, 7, middle, bottom, negative, layer);
		vectorSet4(data, 8, right, bottom, negative, layer);
		break;
	};

	vectorNormalize<3, 4>(data, 0);
	vectorNormalize<3, 4>(data, 1);
	vectorNormalize<3, 4>(data, 2);
	vectorNormalize<3, 4>(data, 3);
	vectorNormalize<3, 4>(data, 4);
	vectorNormalize<3, 4>(data, 5);
	vectorNormalize<3, 4>(data, 6);
	vectorNormalize<3, 4>(data, 7);
	vectorNormalize<3, 4>(data, 8);
}